

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  char cVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  reference pvVar6;
  size_type sVar7;
  iterator iVar8;
  iterator iVar9;
  const_iterator pvVar10;
  size_type sVar11;
  size_type sVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  reference pcVar14;
  undefined1 *puVar15;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool bVar16;
  size_type ind;
  size_type bloc_1;
  value_type c2;
  value_type p;
  size_t seq;
  value_type tc2;
  size_type fnd;
  size_type fndP_2;
  size_type dotloc;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  eit;
  size_type fnd_2;
  value_type *acode_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  array<std::pair<const_char_*,_const_char_*>,_33UL> *__range2_1;
  size_type bloc;
  size_t loc;
  size_type fndP_1;
  size_type nchar;
  size_type fndP;
  size_t ndiv;
  size_type fdiv;
  size_type ploc;
  size_t reploc;
  size_type fnd_1;
  value_type *acode;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::pair<const_char_*,_const_char_*>,_4UL> *__range2;
  size_type c;
  char tail;
  size_t skipMultiplyInsertionAfter;
  bool skipMultiply;
  bool changed;
  bool skipcodereplacement;
  size_type slen;
  string *in_stack_00000350;
  undefined7 in_stack_fffffffffffffd58;
  char in_stack_fffffffffffffd5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  char in_stack_fffffffffffffd7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  __const_iterator in_stack_fffffffffffffd88;
  __const_iterator __p;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  char *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  size_type local_1c0;
  char local_199;
  ulong local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  size_type local_180;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec0;
  undefined1 skipMultiply_00;
  string *in_stack_fffffffffffffec8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  size_type local_128;
  const_iterator local_120;
  const_iterator local_118;
  const_iterator local_110;
  array<std::pair<const_char_*,_const_char_*>,_33UL> *local_108;
  size_type local_100;
  undefined8 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  size_type local_e8;
  uint64_t in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  size_type local_b8;
  const_iterator local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  allocator<char> local_49 [40];
  byte local_21;
  size_type local_20;
  ulong local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(in_RDI);
  local_21 = (local_18 & 0x1000000000) != 0;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd68._M_current,
                   (char)((ulong)in_stack_fffffffffffffd60 >> 0x38));
    std::__cxx11::string::~string(in_stack_fffffffffffffd60);
    std::allocator<char>::~allocator(local_49);
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
  }
  bVar16 = false;
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           back(in_stack_fffffffffffffd60);
  cVar1 = *pvVar6;
  if (((cVar1 == '^') || (cVar1 == '*')) || (cVar1 == '/')) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (in_stack_fffffffffffffd60);
    bVar16 = true;
  }
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd80,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                            (size_type)in_stack_fffffffffffffd70._M_current);
  if (sVar7 == 0xffffffffffffffff) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x730cf8);
    return true;
  }
  if (sVar7 != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd70._M_current,(size_type)in_stack_fffffffffffffd68._M_current,
               (size_type)in_stack_fffffffffffffd60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffd80,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                      (size_type)in_stack_fffffffffffffd70._M_current);
    bVar16 = true;
  }
  pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_fffffffffffffd60,
                      CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  if (*pvVar6 == '/') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd70._M_current,(size_type)in_stack_fffffffffffffd68._M_current,
               (size_type)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f);
    bVar16 = true;
  }
  if ((local_21 & 1) == 0) {
    iVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    iVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            end(in_stack_fffffffffffffd68._M_current);
    bVar3 = std::
            any_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,units::cleanUnitString(std::__cxx11::string&,unsigned_long)::__0>
                      (iVar8._M_current,iVar9._M_current);
    if ((bVar3) && (bVar3 = unicodeReplacement(in_stack_fffffffffffffda0), bVar3)) {
      bVar16 = true;
    }
    local_a0 = std::array<std::pair<const_char_*,_const_char_*>,_4UL>::begin
                         ((array<std::pair<const_char_*,_const_char_*>,_4UL> *)0x730e28);
    pvVar10 = std::array<std::pair<const_char_*,_const_char_*>,_4UL>::end
                        ((array<std::pair<const_char_*,_const_char_*>,_4UL> *)0x730e3c);
    for (; local_a0 != pvVar10; local_a0 = local_a0 + 1) {
      local_b8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 find(in_stack_fffffffffffffd80,
                      (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                      (size_type)in_stack_fffffffffffffd70._M_current);
      while (local_b8 != 0xffffffffffffffff) {
        bVar16 = true;
        strlen(local_a0->first);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                (size_type)in_stack_fffffffffffffd88._M_current,(size_type)in_stack_fffffffffffffd80
                ,(char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        local_b8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(in_stack_fffffffffffffd80,
                        (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                        (size_type)in_stack_fffffffffffffd70._M_current);
      }
    }
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(in_stack_fffffffffffffd80,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                           (size_type)in_stack_fffffffffffffd70._M_current);
    if (sVar11 != 0xffffffffffffffff) {
      iVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                      (size_type)in_stack_fffffffffffffd88._M_current,
                      (size_type)in_stack_fffffffffffffd80,
                      (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      if (iVar5 == 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                (size_type)in_stack_fffffffffffffd88._M_current,(size_type)in_stack_fffffffffffffd80
                ,(char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      }
      ReplaceStringInPlace
                ((string *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd88._M_current,
                 (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                 (int)((ulong)in_stack_fffffffffffffd70._M_current >> 0x20),
                 (size_t *)in_stack_fffffffffffffd68._M_current);
      if ((iVar5 == 0) &&
         (sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x731025),
         sVar11 != 0xffffffffffffffff)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        find_first_of(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x731056);
        do {
          sVar12 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                             (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x731088);
          if (sVar11 < sVar12) {
            if (sVar12 == 0xffffffffffffffff) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffd70._M_current,
                        (char)((ulong)in_stack_fffffffffffffd68._M_current >> 0x38));
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd70._M_current,
                     (size_type)in_stack_fffffffffffffd68._M_current,
                     (size_type)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f);
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70._M_current,
                   (size_type)in_stack_fffffffffffffd68._M_current,
                   (size_type)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f);
          }
        } while (sVar12 != 0xffffffffffffffff);
        in_stack_ffffffffffffff28 = (string *)0xffffffffffffffff;
      }
      checkShortUnits(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
      pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_stack_fffffffffffffd80,
                     (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                     (size_type)in_stack_fffffffffffffd70._M_current);
      while (skipMultiply_00 = (undefined1)((ulong)in_stack_fffffffffffffec0._M_current >> 0x38),
            pbVar2 = local_68,
            pbVar13 !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff)
      {
        local_e8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffd80,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78
                                                ),(size_type)in_stack_fffffffffffffd70._M_current);
        if (local_e8 != 0xffffffffffffffff) {
          pvVar6 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_fffffffffffffd60,
                              CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
          skipMultiply_00 = (undefined1)((ulong)in_stack_fffffffffffffec0._M_current >> 0x38);
          pbVar2 = pbVar13;
          if (*pvVar6 == '(') break;
          pvVar6 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (in_stack_fffffffffffffd60,
                              CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
          skipMultiply_00 = (undefined1)((ulong)in_stack_fffffffffffffec0._M_current >> 0x38);
          pbVar2 = pbVar13;
          if (*pvVar6 == '[') break;
        }
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(in_stack_fffffffffffffd80,
                       (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (size_type)in_stack_fffffffffffffd70._M_current);
      }
      local_68 = pbVar2;
      bVar3 = cleanSpaces(in_stack_fffffffffffffec8,(bool)skipMultiply_00);
      bVar16 = bVar16 || bVar3;
      bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x731278);
      if (bVar3) {
        return true;
      }
    }
    checkPowerOf10(in_stack_fffffffffffffdb0);
  }
  else {
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (in_stack_fffffffffffffd80,
                          (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                          (size_type)in_stack_fffffffffffffd70._M_current);
    if (local_f0 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff) {
      local_68 = local_f0;
    }
  }
  pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           front(in_stack_fffffffffffffd60);
  if (*pvVar6 == '(') {
    removeOuterParenthesis((string *)in_stack_fffffffffffffdc0);
    bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x731308);
    if (bVar3) {
      return true;
    }
  }
  if ((local_21 & 1) == 0) {
    local_f8 = 0;
    bVar3 = ReplaceStringInPlace
                      ((string *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                       in_stack_fffffffffffffd88._M_current,
                       (int)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (int)((ulong)in_stack_fffffffffffffd70._M_current >> 0x20),
                       (size_t *)in_stack_fffffffffffffd68._M_current);
    if (bVar3) {
      bVar16 = true;
    }
  }
  if ((local_18 & 0x200) != 0) {
    ciConversion(in_stack_00000350);
    bVar16 = true;
  }
  if ((local_21 & 1) == 0) {
    local_100 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_last_of(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x7313c1);
    if (local_100 != 0xffffffffffffffff) {
      htmlCodeReplacement((string *)in_stack_fffffffffffffd60);
    }
    local_108 = &cleanUnitString::allCodeReplacements;
    local_110 = std::array<std::pair<const_char_*,_const_char_*>,_33UL>::begin
                          ((array<std::pair<const_char_*,_const_char_*>,_33UL> *)0x7313fc);
    local_118 = std::array<std::pair<const_char_*,_const_char_*>,_33UL>::end
                          ((array<std::pair<const_char_*,_const_char_*>,_33UL> *)0x731410);
    for (; local_110 != local_118; local_110 = local_110 + 1) {
      local_120 = local_110;
      local_128 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(in_stack_fffffffffffffd80,
                       (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (size_type)in_stack_fffffffffffffd70._M_current);
      while (local_128 != 0xffffffffffffffff) {
        bVar16 = true;
        in_stack_fffffffffffffdc0 = local_10;
        strlen(local_120->first);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                (size_type)in_stack_fffffffffffffd88._M_current,(size_type)in_stack_fffffffffffffd80
                ,(char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        local_128 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::find(in_stack_fffffffffffffd80,
                           (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                           (size_type)in_stack_fffffffffffffd70._M_current);
      }
    }
  }
  sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           size(local_10);
  if (sVar11 < 2) goto LAB_00731764;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd68._M_current);
  local_130 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(in_stack_fffffffffffffd68._M_current,
                          (difference_type)in_stack_fffffffffffffd60);
  pcVar14 = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_130);
  if ((*pcVar14 != '2') &&
     (pcVar14 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_130), *pcVar14 != '3')) goto LAB_00731764;
  __gnu_cxx::
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)in_stack_fffffffffffffd68._M_current,(difference_type)in_stack_fffffffffffffd60);
  pcVar14 = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xfffffffffffffec0);
  if (*pcVar14 == '-') {
LAB_007315e7:
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(local_10);
    bVar3 = 2 < sVar11;
  }
  else {
    local_148 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(in_stack_fffffffffffffd68._M_current,
                            (difference_type)in_stack_fffffffffffffd60);
    pcVar14 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_148);
    bVar3 = false;
    if (*pcVar14 == '+') goto LAB_007315e7;
  }
  if (bVar3) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator--(&local_130);
  }
  local_150 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(in_stack_fffffffffffffd68._M_current,
                          (difference_type)in_stack_fffffffffffffd60);
  pcVar14 = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_150);
  bVar3 = isDigitCharacter(*pcVar14);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    local_158 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(in_stack_fffffffffffffd68._M_current,
                            (difference_type)in_stack_fffffffffffffd60);
    pcVar14 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_158);
    iVar5 = (int)*pcVar14;
    if (iVar5 == 0x2a) {
      local_160 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(in_stack_fffffffffffffd68._M_current,
                              (difference_type)in_stack_fffffffffffffd60);
      pcVar14 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_160);
      *pcVar14 = '^';
    }
    else if ((((iVar5 != 0x2b) && (2 < iVar5 - 0x2dU)) && (iVar5 != 0x45)) &&
            ((iVar5 != 0x5e && (iVar5 != 0x65)))) {
      pcVar14 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[](&local_130,0);
      if (*pcVar14 == '+') {
        pcVar14 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_130);
        *pcVar14 = '^';
      }
      else {
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffd60,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  (in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,in_stack_fffffffffffffd7f);
      }
    }
  }
LAB_00731764:
  if ((local_21 & 1) == 0) {
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_last_of(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x73178b);
    if (sVar11 != 0xffffffffffffffff) {
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      bVar3 = isDigitCharacter(*pvVar6);
      if (!bVar3) {
        cleanDotNotation(in_stack_fffffffffffffda0,(uint64_t)in_stack_fffffffffffffd98);
        bVar16 = true;
      }
    }
    local_180 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_stack_fffffffffffffd80,
                     (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                     (size_type)in_stack_fffffffffffffd70._M_current);
    while (local_180 != 0xffffffffffffffff) {
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::size(local_10);
      if (local_180 + 2 < sVar11) {
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        if (*pvVar6 == '^') {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                  (size_type)in_stack_fffffffffffffd88._M_current,
                  (size_type)in_stack_fffffffffffffd80,
                  (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        }
        else {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffd70._M_current,(size_type)in_stack_fffffffffffffd68._M_current
                ,(size_type)in_stack_fffffffffffffd60);
        }
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70._M_current,
                   (size_type)in_stack_fffffffffffffd68._M_current,
                   (size_type)in_stack_fffffffffffffd60);
      }
      local_180 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(in_stack_fffffffffffffd80,
                       (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                       (size_type)in_stack_fffffffffffffd70._M_current);
    }
    clearEmptySegments((string *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    cleanUpPowersOfOne((string *)in_stack_fffffffffffffd70._M_current);
    bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7318f9);
    if (bVar3) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffd70._M_current,
                (char)((ulong)in_stack_fffffffffffffd68._M_current >> 0x38));
      return true;
    }
  }
  while( true ) {
    bVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x73192f);
    bVar3 = false;
    if (!bVar4) {
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front(in_stack_fffffffffffffd60);
      bVar3 = true;
      if (*pvVar6 != '*') {
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                           (in_stack_fffffffffffffd60);
        bVar3 = true;
        if (*pvVar6 != '}') {
          pvVar6 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                             (in_stack_fffffffffffffd60);
          bVar3 = true;
          if (*pvVar6 != ')') {
            pvVar6 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               (in_stack_fffffffffffffd60);
            bVar3 = *pvVar6 == ']';
          }
        }
      }
    }
    if (!bVar3) break;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd70._M_current,(size_type)in_stack_fffffffffffffd68._M_current,
               (size_type)in_stack_fffffffffffffd60);
    bVar16 = true;
    bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7319e4);
    if (bVar3) {
      return true;
    }
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             front(in_stack_fffffffffffffd60);
    if (*pvVar6 == '(') {
      removeOuterParenthesis((string *)in_stack_fffffffffffffdc0);
    }
  }
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of(in_stack_fffffffffffffd80,
                            (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                            (size_type)in_stack_fffffffffffffd70._M_current);
  do {
    pbVar13 = local_188;
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(local_10);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar11 - 1) <= pbVar13
        || local_68 <= local_188) break;
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffd60,
                        CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    switch(*pvVar6) {
    case ')':
    case '*':
    case '/':
    case '>':
    case ']':
    case '^':
    case '}':
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            (in_stack_fffffffffffffd80,
                             (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                             (size_type)in_stack_fffffffffffffd70._M_current);
      break;
    default:
switchD_00731ad4_caseD_2b:
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      if (*pvVar6 == '\\') {
        local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                              (in_stack_fffffffffffffd80,
                               (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78)
                               ,(size_type)in_stack_fffffffffffffd70._M_current);
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd70._M_current,
                   (size_type)in_stack_fffffffffffffd68._M_current,
                   (size_type)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f);
        local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                              (in_stack_fffffffffffffd80,
                               (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78)
                               ,(size_type)in_stack_fffffffffffffd70._M_current);
      }
      break;
    case 'o':
      puVar15 = (undefined1 *)
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(local_10);
      if ((undefined1 *)((long)&(local_188->_M_dataplus)._M_p + 3U) < puVar15) {
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        cVar1 = *pvVar6;
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        if ((((*pvVar6 == 'f') && (cVar1 != ')')) && (cVar1 != ']')) && (cVar1 != '}')) {
          local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      find_first_of(in_stack_fffffffffffffd80,
                                    (char *)CONCAT17(in_stack_fffffffffffffd7f,
                                                     in_stack_fffffffffffffd78),
                                    (size_type)in_stack_fffffffffffffd70._M_current);
          break;
        }
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd70._M_current,
                 (size_type)in_stack_fffffffffffffd68._M_current,
                 (size_type)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f);
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            (in_stack_fffffffffffffd80,
                             (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                             (size_type)in_stack_fffffffffffffd70._M_current);
      break;
    case '{':
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      if (*pvVar6 == '}') goto switchD_00731ad4_caseD_2b;
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            (in_stack_fffffffffffffd80,
                             (char *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                             (size_type)in_stack_fffffffffffffd70._M_current);
    }
  } while( true );
  local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_of(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x731d0b);
  while (__p._M_current = (char *)local_188,
        sVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_10),
        __p._M_current <
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar11 - 3) &&
        local_188 < local_68) {
    pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_fffffffffffffd60,
                        CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    if (*pvVar6 == '-') {
      local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(local_188->_M_dataplus)._M_p + 1);
    }
    in_stack_fffffffffffffd80 = local_188;
    sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             size(local_10);
    if (in_stack_fffffffffffffd80 <
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar11 - 3)) {
      local_198 = 1;
      pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      local_199 = *pvVar6;
      while( true ) {
        in_stack_fffffffffffffd7f = false;
        if (('/' < local_199) && (in_stack_fffffffffffffd7f = false, local_199 < ':')) {
          in_stack_fffffffffffffd70._M_current =
               (char *)((long)&(local_188->_M_dataplus)._M_p + local_198);
          sVar11 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_10)
          ;
          in_stack_fffffffffffffd7f =
               in_stack_fffffffffffffd70._M_current <=
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar11 - 1);
        }
        if ((bool)in_stack_fffffffffffffd7f == false) break;
        local_198 = local_198 + 1;
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        local_199 = *pvVar6;
      }
      in_stack_fffffffffffffd68._M_current =
           (char *)((long)&(local_188->_M_dataplus)._M_p + local_198);
      sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::size(local_10);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar11 - 1) <
          in_stack_fffffffffffffd68._M_current) break;
      if (1 < local_198) {
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        cVar1 = *pvVar6;
        if (((((cVar1 != '\0') && (cVar1 != '*')) && (cVar1 != '/')) &&
            ((cVar1 != '^' && (cVar1 != 'e')))) && (cVar1 != 'E')) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          insert((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd70._M_current,
                 (size_type)in_stack_fffffffffffffd68._M_current,
                 (size_type)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f);
        }
      }
    }
    local_188 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x731fa9);
  }
  bVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x731fc3);
  if ((!bVar3) &&
     (pvVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::front(in_stack_fffffffffffffd60), *pvVar6 == '/')) {
    in_stack_fffffffffffffd60 = local_10;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffd60,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
              (in_stack_fffffffffffffd80,__p,in_stack_fffffffffffffd7f);
    bVar16 = true;
  }
  if ((local_21 & 1) == 0) {
    local_1c0 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x73205e);
    while (local_1c0 != 0xffffffffffffffff) {
      bVar3 = segmentcheck((string *)__p._M_current,(char)((ulong)in_stack_fffffffffffffd80 >> 0x38)
                           ,(size_t *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78))
      ;
      if (bVar3) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd68._M_current,
                    (difference_type)in_stack_fffffffffffffd60);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd68._M_current,
                    (difference_type)in_stack_fffffffffffffd60);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd68._M_current,
                    (difference_type)in_stack_fffffffffffffd60);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd68._M_current,
                    (difference_type)in_stack_fffffffffffffd60);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd68._M_current,
                    (difference_type)in_stack_fffffffffffffd60);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffd68._M_current,
                    (difference_type)in_stack_fffffffffffffd60);
        __first._M_current._7_1_ = in_stack_fffffffffffffd7f;
        __first._M_current._0_7_ = in_stack_fffffffffffffd78;
        std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                  (__first,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (_func_int_int *)in_stack_fffffffffffffd60);
        local_1c0 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x7321d6);
      }
      else {
        local_1c0 = 0xffffffffffffffff;
      }
    }
  }
  if (bVar16) {
    return true;
  }
  sVar11 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           size(local_10);
  return sVar11 != local_20;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 33>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}